

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::~cmInstalledFile(cmInstalledFile *this)

{
  cmCompiledGeneratorExpression *this_00;
  cmInstalledFile *this_local;
  
  this_00 = this->NameExpression;
  if (this_00 != (cmCompiledGeneratorExpression *)0x0) {
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression(this_00);
    operator_delete(this_00,0x170);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
  ::~map(&this->Properties);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmInstalledFile::~cmInstalledFile()
{
  delete NameExpression;
}